

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_secp256k1.cpp
# Opt level: O3

void __thiscall
Secp256k1_TweakPrivkeySecp256k1EcErrorTest_Test::TestBody
          (Secp256k1_TweakPrivkeySecp256k1EcErrorTest_Test *this)

{
  pointer paVar1;
  bool bVar2;
  secp256k1_context_struct *context;
  pointer paVar3;
  ByteData actual;
  Secp256k1 secp;
  TweakPrivkeyTestVector test_vector;
  AssertHelper AStack_c8;
  ByteData local_c0;
  Secp256k1 local_a8;
  anon_struct_112_4_5aca4469 local_a0;
  
  context = wally_get_secp_context();
  cfd::core::Secp256k1::Secp256k1(&local_a8,context);
  paVar1 = tweak_privkey_error_vectors.
           super__Vector_base<TweakPrivkeyTestVector,_std::allocator<TweakPrivkeyTestVector>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (tweak_privkey_error_vectors.
      super__Vector_base<TweakPrivkeyTestVector,_std::allocator<TweakPrivkeyTestVector>_>._M_impl.
      super__Vector_impl_data._M_start !=
      tweak_privkey_error_vectors.
      super__Vector_base<TweakPrivkeyTestVector,_std::allocator<TweakPrivkeyTestVector>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar3 = tweak_privkey_error_vectors.
             super__Vector_base<TweakPrivkeyTestVector,_std::allocator<TweakPrivkeyTestVector>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      anon_struct_112_4_5aca4469::TweakPrivkeyTestVector(&local_a0,paVar3);
      if (local_a0.expect_add._M_string_length == 0) {
        bVar2 = testing::internal::AlwaysTrue();
        if ((bVar2) &&
           (cfd::core::Secp256k1::AddTweakPrivkeySecp256k1Ec
                      (&local_c0,&local_a8,&local_a0.privkey,&local_a0.tweak),
           (long *)local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start != (long *)0x0)) {
          operator_delete(local_c0.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        testing::Message::Message((Message *)&local_c0);
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_secp256k1.cpp"
                   ,0x171,
                   "Expected: ByteData actual = secp.AddTweakPrivkeySecp256k1Ec(test_vector.privkey, test_vector.tweak) throws an exception of type CfdException.\n  Actual: it throws nothing."
                  );
        testing::internal::AssertHelper::operator=(&AStack_c8,(Message *)&local_c0);
        testing::internal::AssertHelper::~AssertHelper(&AStack_c8);
        if ((((long *)local_c0.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start != (long *)0x0) &&
            (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
           ((long *)local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start != (long *)0x0)) {
          (**(code **)(*(long *)local_c0.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start + 8))();
        }
        if (local_a0.expect_add._M_string_length == 0) {
          bVar2 = testing::internal::AlwaysTrue();
          if ((bVar2) &&
             (cfd::core::Secp256k1::MulTweakPrivkeySecp256k1Ec
                        (&local_c0,&local_a8,&local_a0.privkey,&local_a0.tweak),
             (long *)local_c0.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start != (long *)0x0)) {
            operator_delete(local_c0.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          testing::Message::Message((Message *)&local_c0);
          testing::internal::AssertHelper::AssertHelper
                    (&AStack_c8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_secp256k1.cpp"
                     ,0x177,
                     "Expected: ByteData actual = secp.MulTweakPrivkeySecp256k1Ec(test_vector.privkey, test_vector.tweak) throws an exception of type CfdException.\n  Actual: it throws nothing."
                    );
          testing::internal::AssertHelper::operator=(&AStack_c8,(Message *)&local_c0);
          testing::internal::AssertHelper::~AssertHelper(&AStack_c8);
          if ((((long *)local_c0.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start != (long *)0x0) &&
              (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
             ((long *)local_c0.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start != (long *)0x0)) {
            (**(code **)(*(long *)local_c0.data_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 8))();
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.expect_mul._M_dataplus._M_p != &local_a0.expect_mul.field_2) {
        operator_delete(local_a0.expect_mul._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.expect_add._M_dataplus._M_p != &local_a0.expect_add.field_2) {
        operator_delete(local_a0.expect_add._M_dataplus._M_p);
      }
      if (local_a0.tweak.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.tweak.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_a0.privkey.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.privkey.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      paVar3 = paVar3 + 1;
    } while (paVar3 != paVar1);
  }
  return;
}

Assistant:

TEST(Secp256k1, TweakPrivkeySecp256k1EcErrorTest) {
  struct secp256k1_context_struct *cxt = wally_get_secp_context();
  Secp256k1 secp = Secp256k1(cxt);
  for (TweakPrivkeyTestVector test_vector : tweak_privkey_error_vectors) {
    if (test_vector.expect_add.empty()) {
      EXPECT_THROW(
        ByteData actual = secp.AddTweakPrivkeySecp256k1Ec(test_vector.privkey,
          test_vector.tweak),
        CfdException);
    }
    if (test_vector.expect_add.empty()) {
      EXPECT_THROW(
        ByteData actual = secp.MulTweakPrivkeySecp256k1Ec(test_vector.privkey,
          test_vector.tweak),
        CfdException);
    }
  }
}